

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::SetPropertyIdsOfFormals(FunctionBody *this,PropertyIdArray *formalArgs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  PropertyIdOnRegSlotsContainer *ptr;
  
  if (formalArgs == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1355,"(formalArgs)","formalArgs");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  if (pvVar4 == (void *)0x0) {
    ptr = PropertyIdOnRegSlotsContainer::New
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler);
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer,ptr);
  }
  pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  Memory::Recycler::WBSetBit((char *)((long)pvVar4 + 0x10));
  *(PropertyIdArray **)((long)pvVar4 + 0x10) = formalArgs;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((char *)((long)pvVar4 + 0x10));
  return;
}

Assistant:

void FunctionBody::SetPropertyIdsOfFormals(PropertyIdArray * formalArgs)
    {
        Assert(formalArgs);
        if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
        {
            this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
        }
        this->GetPropertyIdOnRegSlotsContainer()->SetFormalArgs(formalArgs);
    }